

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

uint8_t mpt::basetype(type_t org)

{
  bool local_26;
  int local_24;
  type_t local_20;
  uint8_t local_18;
  type_t org_local;
  
  if (org == 0) {
    local_18 = '\0';
  }
  else {
    local_20 = org;
    if (0xff < org) {
      if (org == 0x802) {
        local_24 = 0xb;
      }
      else {
        local_26 = true;
        if ((org != 0x80) && (local_26 = true, org != 0x801)) {
          local_26 = 0xff < org && org < 0x800;
        }
        local_24 = 0;
        if (local_26) {
          local_24 = 0x80;
        }
      }
      local_20 = (type_t)local_24;
    }
    local_18 = (uint8_t)local_20;
  }
  return local_18;
}

Assistant:

inline __MPT_CONST_TYPE uint8_t basetype(MPT_TYPE(type) org) {
	return (org == 0)
		? 0
		: (org <= _TypeDynamicMax)
			? org
			: (org == TypeArray)
				? TypeBufferPtr
				: (MPT_type_isConvertable(org))
					? TypeConvertablePtr
					: 0;
}